

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrExternalCameraIntrinsicsOCULUS *value)

{
  return XR_SUCCESS;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrExternalCameraIntrinsicsOCULUS* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}